

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_FireRailgun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  bool local_51;
  bool local_4e;
  bool local_4b;
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self_00 = (AActor *)(param->field_0).field_1.a;
  local_4b = true;
  if (self_00 != (AActor *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar1 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
      bVar1 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this = (DObject *)param[1].field_0.field_1.a;
    local_4e = true;
    if (this != (DObject *)0x0) {
      local_4e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_4e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    local_48 = (void *)0x0;
  }
  else {
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_48 = param[2].field_0.field_1.a;
  }
  local_51 = false;
  if ((self_00->player != (player_t *)0x0) && (local_51 = false, local_48 != (void *)0x0)) {
    local_51 = *(int *)((long)local_48 + 8) == 1;
  }
  FireRailgun(self_00,0,local_51);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireRailgun)
{
	PARAM_ACTION_PROLOGUE;
	FireRailgun(self, 0, ACTION_CALL_FROM_PSPRITE());
	return 0;
}